

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O0

int act_swap_hdrs(nt_opts *opts)

{
  int iVar1;
  nifti_image *nim_00;
  float *data;
  size_t sVar2;
  char *pcVar3;
  int local_84;
  int local_74;
  int local_64;
  char *local_58;
  char *str;
  char cStack_48;
  char cStack_47;
  char cStack_46;
  char func [13];
  char *dupname;
  char *fname;
  int swap;
  int filec;
  nifti_image *nim;
  nifti_1_header *nhdr;
  nt_opts *opts_local;
  
  str._3_1_ = 'a';
  str._4_1_ = 'c';
  str._5_1_ = 't';
  str._6_1_ = '_';
  str._7_1_ = 'm';
  cStack_48 = 'o';
  cStack_47 = 'd';
  cStack_46 = '_';
  builtin_strncpy(func,"hdrs",5);
  fname._0_4_ = opts->swap_hdr + opts->swap_ana + opts->swap_old;
  nhdr = (nifti_1_header *)opts;
  if ((int)fname < 2) {
    if ((int)fname == 0) {
      opts_local._4_4_ = 0;
    }
    else {
      if (2 < g_debug) {
        fprintf(_stderr,"-d swapping headers of %d files...\n",(ulong)(uint)(opts->infiles).len);
      }
      for (fname._4_4_ = 0; fname._4_4_ < *(int *)(nhdr->aux_file + 0xc);
          fname._4_4_ = fname._4_4_ + 1) {
        dupname = *(char **)(*(long *)(nhdr->aux_file + 0x14) + (long)fname._4_4_ * 8);
        iVar1 = nifti_is_gzfile(dupname);
        if (iVar1 == 0) {
          nim = (nifti_image *)nt_read_header((nt_opts *)nhdr,dupname,(int *)&fname,0);
          if (nim == (nifti_image *)0x0) {
            return 1;
          }
          if (1 < g_debug) {
            local_58 = "NIfTI";
            if ((*(int *)(nhdr->dim + 6) != 0) ||
               ((nhdr->intent_p1 != 0.0 &&
                ((((*(char *)((nim->qto_ijk).m[3] + 3) != 'n' ||
                   (*(char *)((long)(nim->qto_ijk).m[3] + 0xf) != '\0')) ||
                  ((*(char *)((long)(nim->qto_ijk).m[3] + 0xd) != 'i' &&
                   (*(char *)((long)(nim->qto_ijk).m[3] + 0xd) != '+')))) ||
                 (((*(char *)((long)(nim->qto_ijk).m[3] + 0xe) < '1' ||
                   ('9' < *(char *)((long)(nim->qto_ijk).m[3] + 0xe))) ||
                  (*(char *)((long)(nim->qto_ijk).m[3] + 0xe) == '0')))))))) {
              local_58 = "ANALYZE";
            }
            pcVar3 = "";
            if (nhdr->intent_p1 != 0.0) {
              pcVar3 = "OLD ";
            }
            fprintf(_stderr,"-d %sswapping %s header of file %s\n",pcVar3,local_58,dupname);
          }
          if ((int)fname == 0) {
            if (nhdr->intent_p1 == 0.0) {
              swap_nifti_header((nifti_1_header *)nim,(uint)(*(int *)(nhdr->dim + 6) == 0));
            }
            else {
              if ((((*(char *)((nim->qto_ijk).m[3] + 3) == 'n') &&
                   (*(char *)((long)(nim->qto_ijk).m[3] + 0xf) == '\0')) &&
                  ((*(char *)((long)(nim->qto_ijk).m[3] + 0xd) == 'i' ||
                   (*(char *)((long)(nim->qto_ijk).m[3] + 0xd) == '+')))) &&
                 (('0' < *(char *)((long)(nim->qto_ijk).m[3] + 0xe) &&
                  (*(char *)((long)(nim->qto_ijk).m[3] + 0xe) < ':')))) {
                local_64 = *(char *)((long)(nim->qto_ijk).m[3] + 0xe) + -0x30;
              }
              else {
                local_64 = 0;
              }
              old_swap_nifti_header((nifti_1_header *)nim,local_64);
            }
          }
          else if (((*(int *)(nhdr->dim + 6) == 0) || (*(char *)((nim->qto_ijk).m[3] + 3) != 'n'))
                  || ((((*(char *)((long)(nim->qto_ijk).m[3] + 0xf) != '\0' ||
                        ((*(char *)((long)(nim->qto_ijk).m[3] + 0xd) != 'i' &&
                         (*(char *)((long)(nim->qto_ijk).m[3] + 0xd) != '+')))) ||
                       (*(char *)((long)(nim->qto_ijk).m[3] + 0xe) < '1')) ||
                      (('9' < *(char *)((long)(nim->qto_ijk).m[3] + 0xe) ||
                       (*(char *)((long)(nim->qto_ijk).m[3] + 0xe) == '0')))))) {
            if ((*(int *)(nhdr->dim + 4) == 0) ||
               ((((*(char *)((nim->qto_ijk).m[3] + 3) == 'n' &&
                  (*(char *)((long)(nim->qto_ijk).m[3] + 0xf) == '\0')) &&
                 ((*(char *)((long)(nim->qto_ijk).m[3] + 0xd) == 'i' ||
                  (*(char *)((long)(nim->qto_ijk).m[3] + 0xd) == '+')))) &&
                ((('0' < *(char *)((long)(nim->qto_ijk).m[3] + 0xe) &&
                  (*(char *)((long)(nim->qto_ijk).m[3] + 0xe) < ':')) &&
                 (*(char *)((long)(nim->qto_ijk).m[3] + 0xe) != '0')))))) {
              if (nhdr->intent_p1 != 0.0) {
                if (((*(char *)((nim->qto_ijk).m[3] + 3) == 'n') &&
                    (*(char *)((long)(nim->qto_ijk).m[3] + 0xf) == '\0')) &&
                   (((*(char *)((long)(nim->qto_ijk).m[3] + 0xd) == 'i' ||
                     (*(char *)((long)(nim->qto_ijk).m[3] + 0xd) == '+')) &&
                    (('0' < *(char *)((long)(nim->qto_ijk).m[3] + 0xe) &&
                     (*(char *)((long)(nim->qto_ijk).m[3] + 0xe) < ':')))))) {
                  local_74 = *(char *)((long)(nim->qto_ijk).m[3] + 0xe) + -0x30;
                }
                else {
                  local_74 = 0;
                }
                swap_nifti_header((nifti_1_header *)nim,local_74);
                if ((((*(char *)((nim->qto_ijk).m[3] + 3) == 'n') &&
                     (*(char *)((long)(nim->qto_ijk).m[3] + 0xf) == '\0')) &&
                    ((*(char *)((long)(nim->qto_ijk).m[3] + 0xd) == 'i' ||
                     (*(char *)((long)(nim->qto_ijk).m[3] + 0xd) == '+')))) &&
                   (('0' < *(char *)((long)(nim->qto_ijk).m[3] + 0xe) &&
                    (*(char *)((long)(nim->qto_ijk).m[3] + 0xe) < ':')))) {
                  local_84 = *(char *)((long)(nim->qto_ijk).m[3] + 0xe) + -0x30;
                }
                else {
                  local_84 = 0;
                }
                old_swap_nifti_header((nifti_1_header *)nim,local_84);
              }
            }
            else {
              swap_nifti_header((nifti_1_header *)nim,0);
              swap_nifti_header((nifti_1_header *)nim,1);
            }
          }
          else {
            swap_nifti_header((nifti_1_header *)nim,1);
            swap_nifti_header((nifti_1_header *)nim,0);
          }
          func[5] = '\0';
          func[6] = '\0';
          func[7] = '\0';
          func[8] = '\0';
          func[9] = '\0';
          func[10] = '\0';
          func[0xb] = '\0';
          func[0xc] = '\0';
          if (*(long *)(nhdr->descrip + 0x14) != 0) {
            nim_00 = nt_image_read((nt_opts *)nhdr,dupname,1);
            _swap = nim_00;
            if (nim_00 == (nifti_image *)0x0) {
              fprintf(_stderr,"** failed to dup file \'%s\' before modifying\n",dupname);
              return 1;
            }
            if (*(int *)(nhdr->descrip + 0xc) != 0) {
              data = &nhdr->quatern_b;
              sVar2 = strlen((char *)&nhdr->quatern_b);
              iVar1 = nifti_add_extension(nim_00,(char *)data,(int)sVar2,6);
              if (iVar1 != 0) {
                fprintf(_stderr,"** failed to add command to image as exten\n");
              }
            }
            iVar1 = nifti_set_filenames(_swap,*(char **)(nhdr->descrip + 0x14),1,1);
            if (iVar1 != 0) {
              fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",(long)&str + 3,
                      "failed to set prefix for new file: ",*(undefined8 *)(nhdr->descrip + 0x14));
              nifti_image_free(_swap);
              return 1;
            }
            dupname = nifti_strdup(_swap->fname);
            func._5_8_ = dupname;
            nifti_image_write(_swap);
            if (0x15b < _swap->iname_offset) {
              nim->pixdim[0] = (float)_swap->iname_offset;
            }
            nifti_image_free(_swap);
          }
          write_hdr_to_file((nifti_1_header *)nim,dupname);
          if (func._5_8_ != 0) {
            free((void *)func._5_8_);
          }
          free(nim);
        }
        else {
          fprintf(_stderr,"** sorry, cannot swap a gzipped header: %s\n",dupname);
        }
      }
      opts_local._4_4_ = 0;
    }
  }
  else {
    fprintf(_stderr,"** can perform only one swap method\n");
    opts_local._4_4_ = 1;
  }
  return opts_local._4_4_;
}

Assistant:

int act_swap_hdrs( nt_opts * opts )
{
   nifti_1_header * nhdr;
   nifti_image    * nim;         /* for reading/writing entire datasets */
   int              filec, swap;
   char           * fname, * dupname;
   char             func[] = { "act_mod_hdrs" };

   /* count requested operations: "there can be only one", and not Sean */
   swap = opts->swap_hdr + opts->swap_ana + opts->swap_old;
   if( swap > 1 ) {
      fprintf(stderr,"** can perform only one swap method\n");
      return 1;
   } else if( ! swap )
      return 0; /* probably shouldn't be here */

   if( g_debug > 2 )
      fprintf(stderr,"-d swapping headers of %d files...\n",opts->infiles.len);

   for( filec = 0; filec < opts->infiles.len; filec++ )
   {
      fname = opts->infiles.list[filec];  /* for convenience and mod file */

      if( nifti_is_gzfile(fname) ){
         fprintf(stderr,"** sorry, cannot swap a gzipped header: %s\n", fname);
         continue;
      }

      /* do not validate the header structure */
      nhdr = nt_read_header(opts, fname, &swap, 0);
      if( !nhdr ) return 1;

      if( g_debug > 1 ) {
         char * str = "NIfTI";
         if( opts->swap_ana || (opts->swap_old && !NIFTI_VERSION(*nhdr)) )
            str = "ANALYZE";
         fprintf(stderr,"-d %sswapping %s header of file %s\n",
                 opts->swap_old ? "OLD " : "", str, fname);
      }

      if( ! swap ) {    /* if not yet swapped, do as the user requested */

         if( opts->swap_old ) old_swap_nifti_header(nhdr, NIFTI_VERSION(*nhdr));
         else                 swap_nifti_header(nhdr, opts->swap_ana ? 0 : 1);

      } else {          /* swapped already: if not correct, need to undo */

         /* if swapped the wrong way, undo and swap as the user requested */
         if ( opts->swap_ana && NIFTI_VERSION(*nhdr) ) {
            /* want swapped as ANALYZE, but was swapped as NIFTI */
            swap_nifti_header(nhdr, 1);  /* undo NIFTI */
            swap_nifti_header(nhdr, 0);  /* swap ANALYZE */
         } else if( opts->swap_hdr && !NIFTI_VERSION(*nhdr) ) {
            /* want swapped as NIFTI, but was swapped as ANALYZE */
            swap_nifti_header(nhdr, 0);  /* undo ANALYZE */
            swap_nifti_header(nhdr, 1);  /* swap NIFTI */
         } else if ( opts->swap_old ) {
            /* undo whichever was done and apply the old way */
            swap_nifti_header(nhdr, NIFTI_VERSION(*nhdr));
            old_swap_nifti_header(nhdr, NIFTI_VERSION(*nhdr));
         }

         /* else it was swapped the right way to begin with */

      }

      dupname = NULL;                     /* unless we duplicate file   */

      /* possibly duplicate the current dataset before writing new header */
      if( opts->prefix )
      {
         nim = nt_image_read(opts, fname, 1); /* get data */
         if( !nim ) {
            fprintf(stderr,"** failed to dup file '%s' before modifying\n",
                    fname);
            return 1;
         }
         if( opts->keep_hist && nifti_add_extension(nim, opts->command,
                                strlen(opts->command), NIFTI_ECODE_COMMENT) )
               fprintf(stderr,"** failed to add command to image as exten\n");
         if( nifti_set_filenames(nim, opts->prefix, 1, 1) )
         {
            NTL_FERR(func,"failed to set prefix for new file: ",opts->prefix);
            nifti_image_free(nim);
            return 1;
         }
         dupname = nifti_strdup(nim->fname);  /* so we know to free it */
         fname = dupname;
         nifti_image_write(nim);  /* create the duplicate file */
         /* if we added a history note, get the new offset into the header */
         /* mod: if the new offset is valid, use it    31 Jan 2006 [rickr] */
         if( nim->iname_offset >= 348 ) nhdr->vox_offset = nim->iname_offset;
         nifti_image_free(nim);
      }

      /* if all is well, overwrite header in fname dataset */
      (void)write_hdr_to_file(nhdr, fname); /* errors printed in function */

      if( dupname ) free(dupname);
      free(nhdr);
   }

   return 0;
}